

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O2

TestNode * __thiscall xe::TestGroup::findChildNode(TestGroup *this,char *path)

{
  pointer ppTVar1;
  bool bVar2;
  uint compLen;
  Error *this_00;
  pointer ppTVar3;
  
  while( true ) {
    compLen = getFirstComponentLength(path);
    if ((int)compLen < 1) {
      this_00 = (Error *)__cxa_allocate_exception(0x10);
      Error::Error(this_00,(char *)0x0,"compLen > 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTestCase.cpp"
                   ,0xce);
      __cxa_throw(this_00,&Error::typeinfo,std::runtime_error::~runtime_error);
    }
    ppTVar3 = (this->m_children).super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppTVar1 = (this->m_children).super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (ppTVar3 == ppTVar1) {
        return (TestNode *)0x0;
      }
      this = (TestGroup *)*ppTVar3;
      bVar2 = compareNameToPathComponent
                        ((this->super_TestNode).m_name._M_dataplus._M_p,path,compLen);
      ppTVar3 = ppTVar3 + 1;
    } while (!bVar2);
    if (path[compLen] == '\0') break;
    path = path + (ulong)compLen + 1;
    if ((this->super_TestNode).m_nodeType != TESTNODETYPE_GROUP) {
      return (TestNode *)0x0;
    }
  }
  return &this->super_TestNode;
}

Assistant:

const TestNode* TestGroup::findChildNode (const char* path) const
{
	int compLen = getFirstComponentLength(path);
	XE_CHECK(compLen > 0);

	// Try to find matching children.
	const TestNode* matchingNode = DE_NULL;
	for (vector<TestNode*>::const_iterator iter = m_children.begin(); iter != m_children.end(); iter++)
	{
		if (compareNameToPathComponent((*iter)->getName(), path, compLen))
		{
			matchingNode = *iter;
			break;
		}
	}

	if (matchingNode)
	{
		if (path[compLen] == 0)
			return matchingNode; // Last element in path, return matching node.
		else if (matchingNode->getNodeType() == TESTNODETYPE_GROUP)
			return static_cast<const TestGroup*>(matchingNode)->findChildNode(path + compLen + 1);
		else
			return DE_NULL;
	}
	else
		return DE_NULL;
}